

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_proxy.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::ProxyEndpoint::Send
          (Error *__return_storage_ptr__,ProxyEndpoint *this,ByteArray *aRequest,
          MessageSubType aSubType)

{
  char cVar1;
  ErrorCode EVar2;
  type tVar3;
  long lVar4;
  int iVar5;
  Error *pEVar6;
  char *pcVar7;
  char *pcVar8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  undefined1 local_178 [8];
  _Alloc_hider local_170;
  pointer local_168;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_160;
  parse_func local_150 [1];
  undefined1 local_148 [8];
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_120;
  ByteArray udpPayload;
  string local_100;
  writer write;
  _Any_data local_d8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  Request udpTx;
  
  __return_storage_ptr__->mCode = kNone;
  local_120 = &__return_storage_ptr__->mMessage;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  coap::Message::Message(&udpTx,kNonConfirmable,kPost);
  udpPayload.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  udpPayload.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  udpPayload.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (*(this->super_Endpoint)._vptr_Endpoint[3])(local_178,this);
  if ((pointer)CONCAT44(local_178._4_4_,local_178._0_4_) == (pointer)local_170._M_p) {
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_178);
LAB_0017a315:
    local_178._0_4_ = none_type;
    local_170._M_p = "no valid IPv6 peer address";
    local_168 = (pointer)0x1a;
    local_160._M_allocated_capacity = 0;
    local_150[0] = (parse_func)0x0;
    pcVar7 = "no valid IPv6 peer address";
    local_160._8_8_ = local_178;
    while (pcVar8 = pcVar7, pcVar8 != "") {
      pcVar7 = pcVar8 + 1;
      if (*pcVar8 == '}') {
        if ((pcVar7 == "") || (*pcVar7 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar7 = pcVar8 + 2;
      }
      else if (*pcVar8 == '{') {
        pcVar7 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar8,"",(format_string_checker<char> *)local_178);
      }
    }
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_178;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_100,(v10 *)"no valid IPv6 peer address",(string_view)ZEXT816(0x1a),args);
    local_148._0_4_ = kInvalidState;
    std::__cxx11::string::string((string *)&local_140,(string *)&local_100);
  }
  else {
    (*(this->super_Endpoint)._vptr_Endpoint[3])(local_148,this);
    lVar4 = CONCAT44(local_148._4_4_,local_148._0_4_);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_148);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_178);
    if ((long)local_140._M_impl.super__Vector_impl_data._M_start - lVar4 != 0x10) goto LAB_0017a315;
    if ((this->mBrClient->mDtlsSession).mState == kConnected) {
      utils::Encode<unsigned_short>(&udpPayload,0xf0bf);
      iVar5 = (*(this->super_Endpoint)._vptr_Endpoint[4])(this);
      utils::Encode<unsigned_short>(&udpPayload,(unsigned_short)iVar5);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::
      insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)&udpPayload,
                 (const_iterator)
                 udpPayload.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_finish,
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )(aRequest->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_start,
                 (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )(aRequest->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                   _M_impl.super__Vector_impl_data._M_finish);
      std::__cxx11::string::string((string *)local_148,"/c/ut",(allocator *)&local_100);
      coap::Message::SetUriPath((Error *)local_178,&udpTx,(string *)local_148);
      pEVar6 = Error::operator=(__return_storage_ptr__,(Error *)local_178);
      EVar2 = pEVar6->mCode;
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)local_148);
      if (EVar2 == kNone) {
        tlv::Tlv::Tlv((Tlv *)local_148,kIpv6Address,&(this->mPeerAddr).mBytes,kMeshCoP);
        AppendTlv((Error *)local_178,&udpTx,(Tlv *)local_148);
        pEVar6 = Error::operator=(__return_storage_ptr__,(Error *)local_178);
        EVar2 = pEVar6->mCode;
        std::__cxx11::string::~string((string *)&local_170);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_140);
        if (EVar2 == kNone) {
          tlv::Tlv::Tlv((Tlv *)local_148,kUdpEncapsulation,&udpPayload,kMeshCoP);
          AppendTlv((Error *)local_178,&udpTx,(Tlv *)local_148);
          pEVar6 = Error::operator=(__return_storage_ptr__,(Error *)local_178);
          EVar2 = pEVar6->mCode;
          std::__cxx11::string::~string((string *)&local_170);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    (&local_140);
          if (EVar2 == kNone) {
            local_c8 = 0;
            uStack_c0 = 0;
            local_d8._M_unused._M_object = (void *)0x0;
            local_d8._8_8_ = 0;
            coap::CoapSecure::SendRequest(this->mBrClient,&udpTx,(ResponseHandler *)&local_d8);
            std::_Function_base::~_Function_base((_Function_base *)&local_d8);
          }
        }
      }
      goto LAB_0017a3d8;
    }
    local_178._0_4_ = none_type;
    local_170._M_p = "not connected to the border agent";
    local_168 = (pointer)0x21;
    local_160._M_allocated_capacity = 0;
    local_150[0] = (parse_func)0x0;
    pcVar7 = "not connected to the border agent";
    local_160._8_8_ = local_178;
    write.handler_ = (format_string_checker<char> *)local_178;
    while (pcVar7 != "") {
      cVar1 = *pcVar7;
      pcVar8 = pcVar7;
      while (cVar1 != '{') {
        pcVar8 = pcVar8 + 1;
        if (pcVar8 == "") {
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()(&write,pcVar7,"");
          goto LAB_0017a4ea;
        }
        cVar1 = *pcVar8;
      }
      ::fmt::v10::detail::
      parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
      operator()(&write,pcVar7,pcVar8);
      pcVar7 = ::fmt::v10::detail::
               parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                         (pcVar8,"",(format_string_checker<char> *)local_178);
    }
LAB_0017a4ea:
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_178;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_100,(v10 *)"not connected to the border agent",(string_view)ZEXT816(0x21),
               args_00);
    local_148._0_4_ = kInvalidState;
    std::__cxx11::string::string((string *)&local_140,(string *)&local_100);
  }
  Error::operator=(__return_storage_ptr__,(Error *)local_148);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_100);
LAB_0017a3d8:
  tVar3 = __return_storage_ptr__->mCode;
  if (tVar3 != none_type) {
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                   "sending UDP_TX.ntf message failed, ",local_120);
    local_178._0_4_ = tVar3;
    std::__cxx11::string::string((string *)&local_170,(string *)local_148);
    Error::operator=(__return_storage_ptr__,(Error *)local_178);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)local_148);
  }
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&udpPayload.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  coap::Message::~Message(&udpTx);
  return __return_storage_ptr__;
}

Assistant:

Error ProxyEndpoint::Send(const ByteArray &aRequest, MessageSubType aSubType)
{
    Error         error;
    coap::Request udpTx{coap::Type::kNonConfirmable, coap::Code::kPost};
    ByteArray     udpPayload;

    (void)aSubType;

    VerifyOrExit(GetPeerAddr().IsValid() && GetPeerAddr().IsIpv6(),
                 error = ERROR_INVALID_STATE("no valid IPv6 peer address"));

    VerifyOrExit(mBrClient.IsConnected(), error = ERROR_INVALID_STATE("not connected to the border agent"));

    // set the source port to default mamagement port for UDP_Tx message
    utils::Encode<uint16_t>(udpPayload, kDefaultMmPort);
    utils::Encode<uint16_t>(udpPayload, GetPeerPort());
    udpPayload.insert(udpPayload.end(), aRequest.begin(), aRequest.end());

    SuccessOrExit(error = udpTx.SetUriPath(uri::kUdpTx));
    SuccessOrExit(error = AppendTlv(udpTx, {tlv::Type::kIpv6Address, mPeerAddr.GetRaw()}));
    SuccessOrExit(error = AppendTlv(udpTx, {tlv::Type::kUdpEncapsulation, udpPayload}));

    mBrClient.SendRequest(udpTx, nullptr);

exit:
    if (error != ErrorCode::kNone)
    {
        error = Error{error.GetCode(), "sending UDP_TX.ntf message failed, " + error.GetMessage()};
    }
    return error;
}